

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O0

void Decode85(uchar *src,uchar *dst)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  uchar *puStack_18;
  uint tmp;
  uchar *dst_local;
  uchar *src_local;
  
  puStack_18 = dst;
  for (dst_local = src; *dst_local != '\0'; dst_local = dst_local + 5) {
    uVar1 = Decode85Byte(*dst_local);
    uVar2 = Decode85Byte(dst_local[1]);
    uVar3 = Decode85Byte(dst_local[2]);
    uVar4 = Decode85Byte(dst_local[3]);
    uVar5 = Decode85Byte(dst_local[4]);
    iVar6 = uVar1 + (uVar2 + (uVar3 + (uVar4 + uVar5 * 0x55) * 0x55) * 0x55) * 0x55;
    *puStack_18 = (uchar)iVar6;
    puStack_18[1] = (uchar)((uint)iVar6 >> 8);
    puStack_18[2] = (uchar)((uint)iVar6 >> 0x10);
    puStack_18[3] = (uchar)((uint)iVar6 >> 0x18);
    puStack_18 = puStack_18 + 4;
  }
  return;
}

Assistant:

static void         Decode85(const unsigned char* src, unsigned char* dst)
{
    while (*src)
    {
        unsigned int tmp = Decode85Byte(src[0]) + 85 * (Decode85Byte(src[1]) + 85 * (Decode85Byte(src[2]) + 85 * (Decode85Byte(src[3]) + 85 * Decode85Byte(src[4]))));
        dst[0] = ((tmp >> 0) & 0xFF); dst[1] = ((tmp >> 8) & 0xFF); dst[2] = ((tmp >> 16) & 0xFF); dst[3] = ((tmp >> 24) & 0xFF);   // We can't assume little-endianness.
        src += 5;
        dst += 4;
    }
}